

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O1

void __thiscall
gl4cts::TextureViewTestGetTexParameter::initTestRuns(TextureViewTestGetTexParameter *this)

{
  pointer *pp_Var1;
  iterator __position;
  uint uVar2;
  int iVar3;
  GLenum GVar4;
  GLenum GVar5;
  undefined4 extraout_var;
  GLint texture_depth;
  uint uVar6;
  GLuint *pGVar7;
  GLuint GVar8;
  uint uVar9;
  long lVar10;
  bool bVar11;
  bool bVar12;
  GLuint GVar13;
  GLuint GVar14;
  _test_run new_test_run;
  int local_88;
  GLint parent_n_immutable_levels;
  GLint parent_num_levels;
  GLint parent_num_layers;
  GLint parent_min_layer;
  GLint parent_min_level;
  uint local_6c;
  _test_texture_type local_68;
  GLenum local_64;
  long local_60;
  vector<gl4cts::TextureViewTestGetTexParameter::_test_run,std::allocator<gl4cts::TextureViewTestGetTexParameter::_test_run>>
  *local_58;
  TextureViewTestGetTexParameter *local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  Functions *gl;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar3);
  local_58 = (vector<gl4cts::TextureViewTestGetTexParameter::_test_run,std::allocator<gl4cts::TextureViewTestGetTexParameter::_test_run>>
              *)&this->m_test_runs;
  local_60 = 0;
  local_50 = this;
  do {
    local_68 = (&DAT_01ade3e0)[local_60];
    local_6c = (int)local_60 - 3;
    local_48 = 0;
    do {
      new_test_run.expected_n_num_levels = 0;
      new_test_run.parent_texture_object_id = 0;
      new_test_run.texture_view_object_created_from_immutable_to_id = 0;
      new_test_run.texture_view_object_created_from_view_to_id = 0;
      new_test_run.expected_n_immutable_levels = 0;
      new_test_run.expected_n_min_layer = 0;
      new_test_run.expected_n_min_level = 0;
      new_test_run.expected_n_num_layers = 0;
      GVar5 = (&DAT_01ade3b0)[local_48];
      new_test_run.texture_type = local_68;
      uVar2 = (uint)local_48;
      uVar9 = uVar2 - 7;
      uVar6 = 2;
      if (uVar9 < 2) {
        uVar6 = 0xc;
      }
      if (local_48 == 7) {
        uVar6 = 6;
      }
      local_38 = (ulong)uVar6;
      bVar11 = (local_48 & 9) != 0;
      GVar8 = (uint)((uVar2 & 0xe) != 4) * 2;
      bVar12 = local_48 != 9;
      if (!bVar12) {
        GVar8 = 0;
      }
      if (!bVar12 || !bVar11) {
        local_38 = 1;
      }
      new_test_run.texture_target = GVar5;
      (*gl->genTextures)(1,&new_test_run.parent_texture_object_id);
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"glGenTextures() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                      ,0xaf7);
      (*gl->bindTexture)(GVar5,new_test_run.parent_texture_object_id);
      GVar4 = (*gl->getError)();
      lVar10 = local_60;
      glu::checkError(GVar4,"glBindTexture() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                      ,0xafa);
      if (lVar10 != 0) {
        texture_depth = 0x10;
        if (uVar9 < 2) {
          texture_depth = 0x40;
        }
        TextureViewUtilities::initTextureStorage
                  (gl,lVar10 == 2,GVar5,texture_depth,(uint)(uVar9 < 2) * 0x20 + 0x20,0x40,0x8058,
                   0x1908,0x1401,6,4,0);
        if (((uint)lVar10 < 5) && ((0x1aU >> ((uint)lVar10 & 0x1f) & 1) != 0)) {
          new_test_run.expected_n_immutable_levels = 6;
          new_test_run.expected_n_num_layers = 1;
          new_test_run.expected_n_num_levels = 6;
          if ((int)GVar5 < 0x8c1a) {
            if (GVar5 == 0x84f5) {
LAB_00a2fb46:
              new_test_run.expected_n_immutable_levels = 1;
              new_test_run.expected_n_num_levels = 1;
            }
            else if (GVar5 == 0x8513) {
              new_test_run.expected_n_num_layers = 6;
            }
            else if (GVar5 == 0x8c18) {
              new_test_run.expected_n_num_layers = 0x20;
            }
          }
          else if ((int)GVar5 < 0x9100) {
            if (GVar5 == 0x8c1a) {
              new_test_run.expected_n_num_layers = 0x10;
            }
            else if (GVar5 == 0x9009) {
              new_test_run.expected_n_num_layers = 0x18;
            }
          }
          else {
            if (GVar5 == 0x9100) goto LAB_00a2fb46;
            if (GVar5 == 0x9102) {
              new_test_run.expected_n_immutable_levels = 1;
              new_test_run.expected_n_num_layers = 0x10;
              new_test_run.expected_n_num_levels = 1;
            }
          }
        }
      }
      local_64 = GVar5;
      if (local_6c < 2) {
        local_40 = (ulong)(uVar2 - 9 < 0xfffffffe && (bVar12 && bVar11));
        local_88 = 0;
        do {
          bVar11 = local_88 != 0;
          pGVar7 = &new_test_run.texture_view_object_created_from_view_to_id;
          if (!bVar11) {
            pGVar7 = &new_test_run.texture_view_object_created_from_immutable_to_id;
          }
          (*gl->genTextures)(1,pGVar7);
          GVar5 = (*gl->getError)();
          glu::checkError(GVar5,"glGenTextures() call failed",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                          ,0xb71);
          GVar13 = (GLuint)local_40;
          GVar14 = (GLuint)local_38;
          (*gl->textureView)((&new_test_run.texture_view_object_created_from_immutable_to_id)
                             [bVar11],new_test_run.texture_target,
                             (&new_test_run.parent_texture_object_id)[bVar11],0x8058,GVar8,3,GVar13,
                             GVar14);
          GVar5 = (*gl->getError)();
          glu::checkError(GVar5,"glTextureView() call failed",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                          ,0xb76);
          GVar5 = local_64;
          parent_min_level = -1;
          parent_min_layer = -1;
          parent_num_layers = -1;
          parent_num_levels = -1;
          parent_n_immutable_levels = -1;
          (*gl->bindTexture)(local_64,(&new_test_run.parent_texture_object_id)[bVar11]);
          GVar4 = (*gl->getError)();
          glu::checkError(GVar4,"glBindTexture() call failed",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                          ,0xb80);
          (*gl->getTexParameteriv)(GVar5,0x82df,&parent_n_immutable_levels);
          GVar4 = (*gl->getError)();
          glu::checkError(GVar4,
                          "glGetTexParameteriv() failed for GL_TEXTURE_IMMUTABLE_LEVELS pname queried for parent object"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                          ,0xb85);
          (*gl->getTexParameteriv)(GVar5,0x82dd,&parent_min_layer);
          GVar4 = (*gl->getError)();
          glu::checkError(GVar4,
                          "glGetTexParameteriv() failed for GL_TEXTURE_VIEW_MIN_LAYER pname queried for parent object"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                          ,0xb8a);
          (*gl->getTexParameteriv)(GVar5,0x82db,&parent_min_level);
          GVar4 = (*gl->getError)();
          glu::checkError(GVar4,
                          "glGetTexParameteriv() failed for GL_TEXTURE_VIEW_MIN_LEVEL pname queried for parent object"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                          ,0xb8f);
          (*gl->getTexParameteriv)(GVar5,0x82de,&parent_num_layers);
          GVar4 = (*gl->getError)();
          glu::checkError(GVar4,
                          "glGetTexParameteriv() failed for GL_TEXTURE_VIEW_NUM_LAYERS pname queried for parent object"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                          ,0xb94);
          (*gl->getTexParameteriv)(GVar5,0x82dc,&parent_num_levels);
          GVar5 = (*gl->getError)();
          glu::checkError(GVar5,
                          "glGetTexParameteriv() failed for GL_TEXTURE_VIEW_NUM_LEVELS pname queried for parent object"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                          ,0xb99);
          new_test_run.expected_n_min_level = parent_min_level + GVar8;
          new_test_run.expected_n_min_layer = parent_min_layer + GVar13;
          new_test_run.expected_n_immutable_levels = parent_n_immutable_levels;
          new_test_run.expected_n_num_layers = GVar14;
          if ((int)(parent_num_layers - GVar13) < (int)GVar14) {
            new_test_run.expected_n_num_layers = parent_num_layers - GVar13;
          }
          new_test_run.expected_n_num_levels = parent_num_levels - GVar8;
          if (2 < new_test_run.expected_n_num_levels) {
            new_test_run.expected_n_num_levels = 3;
          }
          lVar10 = local_60;
        } while ((local_60 == 4) && (bVar11 = local_88 == 0, local_88 = local_88 + -1, bVar11));
      }
      __position._M_current =
           (local_50->m_test_runs).
           super__Vector_base<gl4cts::TextureViewTestGetTexParameter::_test_run,_std::allocator<gl4cts::TextureViewTestGetTexParameter::_test_run>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (local_50->m_test_runs).
          super__Vector_base<gl4cts::TextureViewTestGetTexParameter::_test_run,_std::allocator<gl4cts::TextureViewTestGetTexParameter::_test_run>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<gl4cts::TextureViewTestGetTexParameter::_test_run,std::allocator<gl4cts::TextureViewTestGetTexParameter::_test_run>>
        ::_M_realloc_insert<gl4cts::TextureViewTestGetTexParameter::_test_run_const&>
                  (local_58,__position,&new_test_run);
      }
      else {
        (__position._M_current)->texture_target = new_test_run.texture_target;
        (__position._M_current)->texture_type = new_test_run.texture_type;
        (__position._M_current)->expected_n_num_levels = new_test_run.expected_n_num_levels;
        (__position._M_current)->parent_texture_object_id = new_test_run.parent_texture_object_id;
        (__position._M_current)->texture_view_object_created_from_immutable_to_id =
             new_test_run.texture_view_object_created_from_immutable_to_id;
        (__position._M_current)->texture_view_object_created_from_view_to_id =
             new_test_run.texture_view_object_created_from_view_to_id;
        (__position._M_current)->expected_n_immutable_levels =
             new_test_run.expected_n_immutable_levels;
        (__position._M_current)->expected_n_min_layer = new_test_run.expected_n_min_layer;
        (__position._M_current)->expected_n_min_level = new_test_run.expected_n_min_level;
        (__position._M_current)->expected_n_num_layers = new_test_run.expected_n_num_layers;
        pp_Var1 = &(local_50->m_test_runs).
                   super__Vector_base<gl4cts::TextureViewTestGetTexParameter::_test_run,_std::allocator<gl4cts::TextureViewTestGetTexParameter::_test_run>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *pp_Var1 = *pp_Var1 + 1;
      }
      local_48 = local_48 + 1;
    } while (local_48 != 10);
    local_60 = lVar10 + 1;
    if (local_60 == 5) {
      return;
    }
  } while( true );
}

Assistant:

void TextureViewTestGetTexParameter::initTestRuns()
{
	const glw::Functions& gl				= m_context.getRenderContext().getFunctions();
	const int			  n_cubemaps_needed = 4; /* only used for GL_TEXTURE_CUBE_MAP_ARRAY */
	const int			  texture_depth		= 16;
	const int			  texture_height	= 32;
	const int			  texture_width		= 64;

	const glw::GLenum texture_targets[] = {
		GL_TEXTURE_1D,		 GL_TEXTURE_1D_ARRAY,		GL_TEXTURE_2D,
		GL_TEXTURE_2D_ARRAY, GL_TEXTURE_2D_MULTISAMPLE, GL_TEXTURE_2D_MULTISAMPLE_ARRAY,
		GL_TEXTURE_3D,		 GL_TEXTURE_CUBE_MAP,		GL_TEXTURE_CUBE_MAP_ARRAY,
		GL_TEXTURE_RECTANGLE
	};
	const _test_texture_type texture_types[] = { TEST_TEXTURE_TYPE_NO_STORAGE_ALLOCATED,
												 TEST_TEXTURE_TYPE_IMMUTABLE_TEXTURE_OBJECT,
												 TEST_TEXTURE_TYPE_MUTABLE_TEXTURE_OBJECT,
												 TEST_TEXTURE_TYPE_TEXTURE_VIEW_CREATED_FROM_IMMUTABLE_TEXTURE_OBJECT,
												 TEST_TEXTURE_TYPE_TEXTURE_VIEW_CREATED_FROM_TEXTURE_VIEW };
	const unsigned int n_texture_targets = sizeof(texture_targets) / sizeof(texture_targets[0]);
	const unsigned int n_texture_types   = sizeof(texture_types) / sizeof(texture_types[0]);

	/* Iterate through all texture types supported by the test */
	for (unsigned int n_texture_type = 0; n_texture_type < n_texture_types; ++n_texture_type)
	{
		const _test_texture_type texture_type = texture_types[n_texture_type];

		/* Iterate through all texture targets supported by the test */
		for (unsigned int n_texture_target = 0; n_texture_target < n_texture_targets; ++n_texture_target)
		{
			_test_run		  new_test_run;
			const glw::GLenum texture_target = texture_targets[n_texture_target];

			/* Texture buffers are neither immutable nor mutable. In order to avoid testing
			 * them in both cases, let's assume they are immutable objects */
			if (texture_target == GL_TEXTURE_BUFFER && texture_type == TEST_TEXTURE_TYPE_MUTABLE_TEXTURE_OBJECT)
			{
				continue;
			}

			/* Set up test run properties. Since we're only testing a single
			 * configuration, we can set these to predefined values..
			 */
			const int  n_levels_needed		 = 6;
			glw::GLint n_min_layer			 = 1;
			glw::GLint n_num_layers			 = 2;
			glw::GLint n_min_level			 = 2;
			glw::GLint n_num_levels			 = 3;
			int		   parent_texture_depth  = texture_depth;
			int		   parent_texture_height = texture_height;
			int		   parent_texture_width  = texture_width;

			new_test_run.texture_target = texture_target;
			new_test_run.texture_type   = texture_type;

			/* Take note of target-specific restrictions */
			if (texture_target == GL_TEXTURE_CUBE_MAP || texture_target == GL_TEXTURE_CUBE_MAP_ARRAY)
			{
				n_num_layers = 6 /* layer-faces */ * 2; /* as per spec */

				/* Make sure that cube face width matches its height */
				parent_texture_height = 64;
				parent_texture_width  = 64;

				/* Also change the depth so that there's at least a few layers
				 * we can use in the test for GL_TEXTURE_CUBE_MAP_ARRAY case
				 */
				parent_texture_depth = 64;
			}

			if (texture_target == GL_TEXTURE_CUBE_MAP)
			{
				/* Texture views created from a cube map texture should always
				 * use a minimum layer of zero
				 */
				n_min_layer  = 0;
				n_num_layers = 6;
			}

			if (texture_target == GL_TEXTURE_CUBE_MAP_ARRAY)
			{
				/* Slightly modify the values we'll use for <minlayer>
				 * and <numlayers> arguments passed to glTextureView() calls
				 * so that we can test the "view from view from texture" case
				 */
				n_min_layer = 0;
			}

			if (texture_target == GL_TEXTURE_1D || texture_target == GL_TEXTURE_2D ||
				texture_target == GL_TEXTURE_2D_MULTISAMPLE || texture_target == GL_TEXTURE_3D ||
				texture_target == GL_TEXTURE_RECTANGLE)
			{
				/* All these texture targets are single-layer only. glTextureView()
				 * also requires <numlayers> argument to be set to 1 for them, so
				 * take this into account.
				 **/
				n_min_layer  = 0;
				n_num_layers = 1;
			}

			if (texture_target == GL_TEXTURE_2D_MULTISAMPLE || texture_target == GL_TEXTURE_2D_MULTISAMPLE_ARRAY ||
				texture_target == GL_TEXTURE_RECTANGLE)
			{
				/* All these texture targets do not support mip-maps */
				n_min_level = 0;
			}

			/* Initialize parent texture object */
			gl.genTextures(1, &new_test_run.parent_texture_object_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures() call failed");

			gl.bindTexture(texture_target, new_test_run.parent_texture_object_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed");

			if (texture_type != TEST_TEXTURE_TYPE_NO_STORAGE_ALLOCATED)
			{
				TextureViewUtilities::initTextureStorage(gl, (texture_type == TEST_TEXTURE_TYPE_MUTABLE_TEXTURE_OBJECT),
														 texture_target, parent_texture_depth, parent_texture_height,
														 parent_texture_width, GL_RGBA8, GL_RGBA, GL_UNSIGNED_BYTE,
														 n_levels_needed, n_cubemaps_needed, 0); /* bo_id */
			}

			/* Update expected view-specific property values to include interactions
			 * with immutable textures. */
			if (texture_type == TEST_TEXTURE_TYPE_IMMUTABLE_TEXTURE_OBJECT ||
				texture_type == TEST_TEXTURE_TYPE_TEXTURE_VIEW_CREATED_FROM_IMMUTABLE_TEXTURE_OBJECT ||
				texture_type == TEST_TEXTURE_TYPE_TEXTURE_VIEW_CREATED_FROM_TEXTURE_VIEW)
			{
				/* Set expected GL_TEXTURE_IMMUTABLE_LEVELS property value to the number
				 * of levels we'll be using for the immutable texture storage. For selected
				 * texture targets that do no take <levels> argument, we'll change this
				 * value on a case-by-case basis.
				 */
				new_test_run.expected_n_immutable_levels = n_levels_needed;

				/* Set expected GL_TEXTURE_VIEW_NUM_LAYERS property value to 1, as per GL spec.
				 * This value will be modified for selected texture targets */
				new_test_run.expected_n_num_layers = 1;

				/* Configured expected GL_TEXTURE_VIEW_NUM_LEVELS value as per GL spec */
				new_test_run.expected_n_num_levels = n_levels_needed;

				/* Initialize immutable texture storage */
				switch (texture_target)
				{
				case GL_TEXTURE_1D_ARRAY:
				{
					/* Update expected GL_TEXTURE_VIEW_NUM_LAYERS property value as per GL specification */
					new_test_run.expected_n_num_layers = texture_height;

					break;
				}

				case GL_TEXTURE_CUBE_MAP:
				{
					/* Update expected GL_TEXTURE_VIEW_NUM_LAYERS property value as per GL specification */
					new_test_run.expected_n_num_layers = 6;

					break;
				}

				case GL_TEXTURE_RECTANGLE:
				{
					new_test_run.expected_n_immutable_levels = 1;
					new_test_run.expected_n_num_levels		 = 1;

					break;
				}

				case GL_TEXTURE_2D_ARRAY:
				{
					/* Update expected GL_TEXTURE_VIEW_NUM_LAYERS property value as per GL specification */
					new_test_run.expected_n_num_layers = texture_depth;

					break;
				}

				case GL_TEXTURE_2D_MULTISAMPLE:
				{
					/* 2D multisample texture are not mip-mapped, so update
					 * expected GL_TEXTURE_IMMUTABLE_LEVELS and GL_TEXTURE_VIEW_NUM_LEVELS
					 * value accordingly */
					new_test_run.expected_n_immutable_levels = 1;
					new_test_run.expected_n_num_levels		 = 1;

					break;
				}

				case GL_TEXTURE_2D_MULTISAMPLE_ARRAY:
				{
					/* 2D multisample array textures are not mip-mapped, so update
					 * expected GL_TEXTURE_IMMUTABLE_LEVELS and GL_TEXTURE_VIEW_NUM_LEVELS
					 * values accordingly */
					new_test_run.expected_n_immutable_levels = 1;
					new_test_run.expected_n_num_levels		 = 1;

					/* Update expected GL_TEXTURE_VIEW_NUM_LAYERS property value as per GL specification */
					new_test_run.expected_n_num_layers = texture_depth;

					break;
				}

				case GL_TEXTURE_CUBE_MAP_ARRAY:
				{
					const unsigned int actual_texture_depth = 6 /* layer-faces */ * n_cubemaps_needed;

					/* Update expected GL_TEXTURE_VIEW_NUM_LAYERS property value as per GL specification */
					new_test_run.expected_n_num_layers = actual_texture_depth;

					break;
				}
				} /* switch (texture_target) */
			}

			/* Initialize the view(s) */
			if (texture_type == TEST_TEXTURE_TYPE_TEXTURE_VIEW_CREATED_FROM_IMMUTABLE_TEXTURE_OBJECT ||
				texture_type == TEST_TEXTURE_TYPE_TEXTURE_VIEW_CREATED_FROM_TEXTURE_VIEW)
			{
				const unsigned int n_iterations =
					(texture_type == TEST_TEXTURE_TYPE_TEXTURE_VIEW_CREATED_FROM_TEXTURE_VIEW) ? 2 : 1;

				for (unsigned int n_iteration = 0; n_iteration < n_iterations; ++n_iteration)
				{
					glw::GLuint* parent_id_ptr = (n_iteration == 0) ?
													 &new_test_run.parent_texture_object_id :
													 &new_test_run.texture_view_object_created_from_immutable_to_id;
					glw::GLuint* view_id_ptr = (n_iteration == 0) ?
												   &new_test_run.texture_view_object_created_from_immutable_to_id :
												   &new_test_run.texture_view_object_created_from_view_to_id;

					gl.genTextures(1, view_id_ptr);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures() call failed");

					gl.textureView(*view_id_ptr, new_test_run.texture_target, *parent_id_ptr,
								   GL_RGBA8, /* use the parent texture object's internalformat */
								   n_min_level, n_num_levels, n_min_layer, n_num_layers);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glTextureView() call failed");

					/* Query parent object's properties */
					glw::GLint parent_min_level			 = -1;
					glw::GLint parent_min_layer			 = -1;
					glw::GLint parent_num_layers		 = -1;
					glw::GLint parent_num_levels		 = -1;
					glw::GLint parent_n_immutable_levels = -1;

					gl.bindTexture(texture_target, *parent_id_ptr);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed");

					gl.getTexParameteriv(texture_target, GL_TEXTURE_IMMUTABLE_LEVELS, &parent_n_immutable_levels);
					GLU_EXPECT_NO_ERROR(
						gl.getError(),
						"glGetTexParameteriv() failed for GL_TEXTURE_IMMUTABLE_LEVELS pname queried for parent object");

					gl.getTexParameteriv(texture_target, GL_TEXTURE_VIEW_MIN_LAYER, &parent_min_layer);
					GLU_EXPECT_NO_ERROR(
						gl.getError(),
						"glGetTexParameteriv() failed for GL_TEXTURE_VIEW_MIN_LAYER pname queried for parent object");

					gl.getTexParameteriv(texture_target, GL_TEXTURE_VIEW_MIN_LEVEL, &parent_min_level);
					GLU_EXPECT_NO_ERROR(
						gl.getError(),
						"glGetTexParameteriv() failed for GL_TEXTURE_VIEW_MIN_LEVEL pname queried for parent object");

					gl.getTexParameteriv(texture_target, GL_TEXTURE_VIEW_NUM_LAYERS, &parent_num_layers);
					GLU_EXPECT_NO_ERROR(
						gl.getError(),
						"glGetTexParameteriv() failed for GL_TEXTURE_VIEW_NUM_LAYERS pname queried for parent object");

					gl.getTexParameteriv(texture_target, GL_TEXTURE_VIEW_NUM_LEVELS, &parent_num_levels);
					GLU_EXPECT_NO_ERROR(
						gl.getError(),
						"glGetTexParameteriv() failed for GL_TEXTURE_VIEW_NUM_LEVELS pname queried for parent object");

					/* Update test run-specific expected values as per GL_ARB_texture_view extension specification */
					/*
					 * - TEXTURE_IMMUTABLE_LEVELS is set to the value of TEXTURE_IMMUTABLE_LEVELS
					 *   from the original texture.
					 */
					new_test_run.expected_n_immutable_levels = parent_n_immutable_levels;

					/*
					 * - TEXTURE_VIEW_MIN_LEVEL is set to <minlevel> plus the value of
					 *   TEXTURE_VIEW_MIN_LEVEL from the original texture.
					 */
					new_test_run.expected_n_min_level = n_min_level + parent_min_level;

					/*
					 * - TEXTURE_VIEW_MIN_LAYER is set to <minlayer> plus the value of
					 *   TEXTURE_VIEW_MIN_LAYER from the original texture.
					 */
					new_test_run.expected_n_min_layer = n_min_layer + parent_min_layer;

					/*
					 * - TEXTURE_VIEW_NUM_LAYERS is set to the lesser of <numlayers> and the
					 *   value of TEXTURE_VIEW_NUM_LAYERS from the original texture minus
					 *   <minlayer>.
					 *
					 */
					if ((parent_num_layers - n_min_layer) < n_num_layers)
					{
						new_test_run.expected_n_num_layers = parent_num_layers - n_min_layer;
					}
					else
					{
						new_test_run.expected_n_num_layers = n_num_layers;
					}

					/*
					 * - TEXTURE_VIEW_NUM_LEVELS is set to the lesser of <numlevels> and the
					 *   value of TEXTURE_VIEW_NUM_LEVELS from the original texture minus
					 *   <minlevels>.
					 *
					 */
					if ((parent_num_levels - n_min_level) < n_num_levels)
					{
						new_test_run.expected_n_num_levels = parent_num_levels - n_min_level;
					}
					else
					{
						new_test_run.expected_n_num_levels = n_num_levels;
					}
				} /* for (all iterations) */
			}	 /* if (texture_type == TEST_TEXTURE_TYPE_TEXTURE_VIEW_CREATED_FROM_IMMUTABLE_TEXTURE_OBJECT ||
			 texture_type == TEST_TEXTURE_TYPE_TEXTURE_VIEW_CREATED_FROM_TEXTURE_VIEW) */

			/* Store the descriptor */
			m_test_runs.push_back(new_test_run);
		} /* for (all texture targets) */
	}	 /* for (all texture types) */
}